

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_string_array
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,char ***out_array,
              cgltf_size *out_size)

{
  int i_00;
  long lVar1;
  ulong uVar2;
  
  i_00 = -1;
  if (((tokens[(uint)i].type == JSMN_ARRAY) &&
      (i_00 = cgltf_parse_json_array
                        (options,tokens,i,(uint8_t *)0x8,(size_t)out_array,(void **)out_size,
                         (cgltf_size *)json_chunk), -1 < i_00)) && (*out_size != 0)) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      i_00 = cgltf_parse_json_string
                       (options,tokens,i_00,json_chunk,(char **)((long)*out_array + lVar1));
      if (i_00 < 0) {
        return i_00;
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 8;
    } while (uVar2 < *out_size);
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_string_array(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, char*** out_array, cgltf_size* out_size)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_ARRAY);
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(char*), (void**)out_array, out_size);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < *out_size; ++j)
	{
		i = cgltf_parse_json_string(options, tokens, i, json_chunk, j + (*out_array));
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}